

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * Lowerer::ChangeToLea(Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3eae,"(instr)","instr");
    if (!bVar2) goto LAB_0056db4d;
    *puVar3 = 0;
  }
  pOVar4 = instr->m_dst;
  if (pOVar4 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3eaf,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) goto LAB_0056db4d;
    *puVar3 = 0;
    pOVar4 = instr->m_dst;
  }
  bVar2 = IR::Opnd::IsRegOpnd(pOVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3eb0,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
    if (!bVar2) goto LAB_0056db4d;
    *puVar3 = 0;
  }
  pOVar4 = instr->m_src1;
  if (pOVar4 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3eb1,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar2) goto LAB_0056db4d;
    *puVar3 = 0;
    pOVar4 = instr->m_src1;
  }
  bVar2 = IR::Opnd::IsIndirOpnd(pOVar4);
  if (!bVar2) {
    bVar2 = IR::Opnd::IsSymOpnd(instr->m_src1);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3eb2,
                         "(instr->GetSrc1()->IsIndirOpnd() || instr->GetSrc1()->IsSymOpnd())",
                         "instr->GetSrc1()->IsIndirOpnd() || instr->GetSrc1()->IsSymOpnd()");
      if (!bVar2) goto LAB_0056db4d;
      *puVar3 = 0;
    }
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3eb3,"(!instr->GetSrc2())","!instr->GetSrc2()");
    if (!bVar2) {
LAB_0056db4d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  instr->m_opcode = LEA;
  LowererMD::Legalize<false>(instr,false);
  return instr;
}

Assistant:

IR::Instr *
Lowerer::ChangeToLea(IR::Instr * instr)
{
    Assert(instr);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsRegOpnd());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc1()->IsIndirOpnd() || instr->GetSrc1()->IsSymOpnd());
    Assert(!instr->GetSrc2());

    instr->m_opcode = LowererMD::MDLea;
    LowererMD::Legalize(instr);
    return instr;
}